

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

int Lf_MemSaveCut(Lf_Mem_t *p,Lf_Cut_t *pCut,int iObj)

{
  size_t __size;
  byte bVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  bool bVar5;
  uint uVar6;
  void *pvVar7;
  void **ppvVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 uVar12;
  byte *pbVar13;
  int iVar14;
  uint uVar15;
  
  if ((pCut->field_0x16 & 0x80) != 0) {
    __assert_fail("!pCut->fMux7",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x211,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
  }
  uVar2 = p->iCur;
  iVar14 = (p->vPages).nSize;
  uVar6 = uVar2;
  if (iVar14 == (int)uVar2 >> ((byte)p->LogPage & 0x1f)) {
    pVVar4 = p->vFree;
    iVar3 = pVVar4->nSize;
    if (iVar3 == 0) {
      pvVar7 = malloc((long)p->MaskPage + 1);
    }
    else {
      if (iVar3 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      pVVar4->nSize = iVar3 - 1U;
      pvVar7 = pVVar4->pArray[iVar3 - 1U];
      iVar14 = (p->vPages).nSize;
    }
    if (iVar14 == (p->vPages).nCap) {
      if (iVar14 < 0x10) {
        ppvVar8 = (p->vPages).pArray;
        if (ppvVar8 == (void **)0x0) {
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(ppvVar8,0x80);
        }
        (p->vPages).pArray = ppvVar8;
        (p->vPages).nCap = 0x10;
      }
      else {
        ppvVar8 = (p->vPages).pArray;
        __size = (ulong)(uint)(iVar14 * 2) * 8;
        if (ppvVar8 == (void **)0x0) {
          ppvVar8 = (void **)malloc(__size);
        }
        else {
          ppvVar8 = (void **)realloc(ppvVar8,__size);
        }
        (p->vPages).pArray = ppvVar8;
        (p->vPages).nCap = iVar14 * 2;
      }
    }
    else {
      ppvVar8 = (p->vPages).pArray;
    }
    iVar3 = (p->vPages).nSize;
    iVar14 = iVar3 + 1;
    (p->vPages).nSize = iVar14;
    ppvVar8[iVar3] = pvVar7;
    uVar6 = p->iCur;
  }
  if ((int)(~uVar6 & p->MaskPage) < 0x38) {
    __assert_fail("p->MaskPage - (p->iCur & p->MaskPage) >= 4 * (LF_LEAF_MAX + 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x214,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
  }
  uVar6 = (int)uVar6 >> ((byte)p->LogPage & 0x1f);
  if (((int)uVar6 < 0) || (iVar14 <= (int)uVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar9 = p->MaskPage & uVar2;
  pvVar7 = (p->vPages).pArray[uVar6];
  uVar12 = (undefined1)((uint)*(int *)&pCut->field_0x14 >> 0x18);
  if (*(int *)&pCut->field_0x14 < 0) {
    *(undefined1 *)((long)pvVar7 + (long)(int)uVar9) = uVar12;
    uVar9 = uVar9 + 1;
    uVar12 = 1;
  }
  *(undefined1 *)((long)pvVar7 + (long)(int)uVar9) = uVar12;
  uVar9 = uVar9 + 1;
  if (0xffffff < *(uint *)&pCut->field_0x14) {
    uVar10 = (ulong)(*(uint *)&pCut->field_0x14 >> 0x18);
    do {
      uVar6 = iObj - *(int *)(&pCut->field_0x14 + uVar10 * 4);
      if (0x7f < uVar6) {
        pbVar13 = (byte *)((long)(int)uVar9 + (long)pvVar7);
        uVar15 = uVar6;
        do {
          *pbVar13 = (byte)uVar15 | 0x80;
          uVar6 = uVar15 >> 7;
          pbVar13 = pbVar13 + 1;
          uVar9 = uVar9 + 1;
          bVar5 = 0x3fff < uVar15;
          uVar15 = uVar6;
        } while (bVar5);
      }
      *(char *)((long)pvVar7 + (long)(int)uVar9) = (char)uVar6;
      iObj = *(int *)(&pCut->field_0x14 + uVar10 * 4);
      uVar9 = uVar9 + 1;
      bVar5 = 1 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar5);
    if (0x1ffffff < *(uint *)&pCut->field_0x14) {
      uVar6 = pCut->iFunc;
      goto LAB_007146e2;
    }
  }
  uVar6 = pCut->iFunc;
  if (3 < (int)uVar6) {
    __assert_fail("pCut->nLeaves >= 2 || pCut->iFunc <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x21a,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
  }
LAB_007146e2:
  if (-1 < (int)uVar6) {
    if (uVar6 < 0x80) {
      uVar10 = (ulong)uVar6;
    }
    else {
      pbVar13 = (byte *)((long)(int)uVar9 + (long)pvVar7);
      uVar10 = (ulong)uVar6;
      do {
        *pbVar13 = (byte)uVar6 | 0x80;
        uVar10 = uVar10 >> 7;
        pbVar13 = pbVar13 + 1;
        uVar9 = uVar9 + 1;
        bVar5 = 0x3fff < uVar6;
        uVar6 = (uint)uVar10;
      } while (bVar5);
    }
    lVar11 = (long)(int)uVar9;
    uVar9 = uVar9 + 1;
    *(char *)((long)pvVar7 + lVar11) = (char)uVar10;
  }
  if ((int)(~uVar9 & p->MaskPage) < 0x38) {
    bVar1 = (byte)p->LogPage;
    uVar9 = (p->iCur >> (bVar1 & 0x1f)) + 1 << (bVar1 & 0x1f);
  }
  else {
    uVar9 = p->iCur & ~p->MaskPage | uVar9;
  }
  p->iCur = uVar9;
  return uVar2;
}

Assistant:

static inline int Lf_MemSaveCut( Lf_Mem_t * p, Lf_Cut_t * pCut, int iObj )
{
    unsigned char * pPlace;
    int i, iPlace, Prev = iObj, iCur = p->iCur;
    assert( !pCut->fMux7 );
    if ( Vec_PtrSize(&p->vPages) == (p->iCur >> p->LogPage) )
        Vec_PtrPush( &p->vPages, Vec_PtrSize(p->vFree) ? Vec_PtrPop(p->vFree) : ABC_ALLOC(char,p->MaskPage+1) );
    assert( p->MaskPage - (p->iCur & p->MaskPage) >= 4 * (LF_LEAF_MAX + 2) );
    iPlace = iCur & p->MaskPage;
    pPlace = (unsigned char *)Vec_PtrEntry(&p->vPages, p->iCur >> p->LogPage);
    iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, pCut->nLeaves );
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
        iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, Prev - pCut->pLeaves[i] ), Prev = pCut->pLeaves[i];
    assert( pCut->nLeaves >= 2 || pCut->iFunc <= 3 );
    if ( pCut->iFunc >= 0 )
        iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, pCut->iFunc );
    if ( p->MaskPage - (iPlace & p->MaskPage) < 4 * (LF_LEAF_MAX + 2) )
        p->iCur = ((p->iCur >> p->LogPage) + 1) << p->LogPage;
    else
        p->iCur = (p->iCur & ~p->MaskPage) | iPlace;
    return iCur;
}